

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O2

uint64_t skiwi::skiwi_run_raw(string *scheme_expression)

{
  uint64_t uVar1;
  runtime_error *this;
  repl_data *in_RCX;
  environment_map *in_RDX;
  string *in_RSI;
  
  if ((anonymous_namespace)::cd != '\0') {
    uVar1 = anon_unknown_1::compile_and_run
                      ((anon_unknown_1 *)scheme_expression,in_RSI,in_RDX,in_RCX);
    return uVar1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Skiwi is not initialized");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint64_t skiwi_run_raw(const std::string& scheme_expression)
  {
  if (!cd.initialized)
    throw std::runtime_error("Skiwi is not initialized");
  return compile_and_run(scheme_expression, cd.env, cd.rd);
  }